

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::TextFlow::Columns::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  bool bVar1;
  char cVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_t sVar5;
  const_reference pvVar6;
  ulong uVar7;
  undefined1 local_a8 [8];
  string col;
  size_t width;
  size_t i;
  string padding;
  iterator *this_local;
  string *row;
  
  padding.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&i);
  width = 0;
  while( true ) {
    sVar3 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
                      (this->m_columns);
    if (sVar3 <= width) break;
    pvVar4 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
             operator[](this->m_columns,width);
    sVar5 = Column::width(pvVar4);
    pvVar6 = std::
             vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
             ::operator[](&this->m_iterators,width);
    pvVar4 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
             operator[](this->m_columns,width);
    Column::end((const_iterator *)((long)&col.field_2 + 8),pvVar4);
    bVar1 = Column::const_iterator::operator!=(pvVar6,(const_iterator *)((long)&col.field_2 + 8));
    if (bVar1) {
      pvVar6 = std::
               vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
               ::operator[](&this->m_iterators,width);
      Column::const_iterator::operator*[abi_cxx11_((string *)local_a8,pvVar6);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_a8);
      std::__cxx11::string::clear();
      uVar7 = std::__cxx11::string::size();
      if (uVar7 < sVar5) {
        cVar2 = std::__cxx11::string::size();
        std::__cxx11::string::append((ulong)&i,(char)sVar5 - cVar2);
      }
      std::__cxx11::string::~string((string *)local_a8);
    }
    else {
      std::__cxx11::string::append((ulong)&i,(char)sVar5);
    }
    width = width + 1;
  }
  padding.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&i);
  if ((padding.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Columns::iterator::operator*() const {
            std::string row, padding;

            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                const auto width = m_columns[i].width();
                if ( m_iterators[i] != m_columns[i].end() ) {
                    std::string col = *m_iterators[i];
                    row += padding;
                    row += col;

                    padding.clear();
                    if ( col.size() < width ) {
                        padding.append( width - col.size(), ' ' );
                    }
                } else {
                    padding.append( width, ' ' );
                }
            }
            return row;
        }